

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O1

void floor_carry_fail(chunk *c,object *drop,_Bool broke)

{
  object *obj;
  _Bool _Var1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  object *known;
  char o_name [80];
  object *local_98;
  object *local_90;
  char local_88 [88];
  
  obj = drop->known;
  local_98 = obj;
  local_90 = drop;
  if (obj != (object *)0x0) {
    bVar4 = drop->number == '\x01';
    pcVar2 = "break";
    if (bVar4) {
      pcVar2 = "breaks";
    }
    pcVar3 = "disappear";
    if (bVar4) {
      pcVar3 = "disappears";
    }
    if (broke) {
      pcVar3 = pcVar2;
    }
    object_desc(local_88,0x50,drop,0,player);
    msg("The %s %s.",local_88,pcVar3);
    _Var1 = loc_is_zero((loc_conflict)obj->grid);
    if (!_Var1) {
      square_excise_object((chunk_conflict *)player->cave,obj->grid,obj);
    }
    delist_object((chunk_conflict *)player->cave,obj);
    object_delete((chunk *)player->cave,(chunk *)0x0,&local_98);
  }
  delist_object((chunk_conflict *)c,drop);
  object_delete(c,(chunk *)player->cave,&local_90);
  return;
}

Assistant:

static void floor_carry_fail(struct chunk *c, struct object *drop, bool broke)
{
	struct object *known = drop->known;

	/* Delete completely */
	if (known) {
		char o_name[80];
		const char *verb = broke ?
			VERB_AGREEMENT(drop->number, "breaks", "break") :
			VERB_AGREEMENT(drop->number, "disappears", "disappear");
		object_desc(o_name, sizeof(o_name), drop, ODESC_BASE, player);
		msg("The %s %s.", o_name, verb);
		if (!loc_is_zero(known->grid))
			square_excise_object(player->cave, known->grid, known);
		delist_object(player->cave, known);
		object_delete(player->cave, NULL, &known);
	}
	delist_object(c, drop);
	object_delete(c, player->cave, &drop);
}